

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O1

void CVmObjGramProd::process_work_queue
               (CVmGramProdMem *mem,vmgramprod_tok *tok,size_t tok_cnt,CVmGramProdQueue *queues,
               CVmObjDict *dict)

{
  CVmGramProdState **ppCVar1;
  CVmGramProdState *pCVar2;
  int iVar3;
  CVmGramProdState *pCVar4;
  CVmGramProdState *pCVar5;
  bool bVar6;
  CVmGramProdState **ppCVar7;
  
  ppCVar1 = &queues->badness_queue_;
  while( true ) {
    if ((queues->work_queue_ == (CVmGramProdState *)0x0) &&
       (queues->success_list_ == (CVmGramProdMatchEntry *)0x0)) {
      pCVar5 = *ppCVar1;
      if (pCVar5 == (CVmGramProdState *)0x0) {
        iVar3 = 0;
      }
      else {
        bVar6 = false;
        iVar3 = 0;
        do {
          if ((!bVar6) || (pCVar5->altp_->badness < iVar3)) {
            iVar3 = pCVar5->altp_->badness;
          }
          pCVar5 = pCVar5->nxt_;
          bVar6 = true;
        } while (pCVar5 != (CVmGramProdState *)0x0);
      }
      if (*ppCVar1 != (CVmGramProdState *)0x0) {
        pCVar4 = (CVmGramProdState *)0x0;
        pCVar5 = *ppCVar1;
        do {
          pCVar2 = pCVar5->nxt_;
          if (pCVar5->altp_->badness == iVar3) {
            ppCVar7 = &pCVar4->nxt_;
            if (pCVar4 == (CVmGramProdState *)0x0) {
              ppCVar7 = ppCVar1;
            }
            *ppCVar7 = pCVar2;
            pCVar5->nxt_ = queues->work_queue_;
            queues->work_queue_ = pCVar5;
            pCVar5 = pCVar4;
          }
          pCVar4 = pCVar5;
          pCVar5 = pCVar2;
        } while (pCVar2 != (CVmGramProdState *)0x0);
      }
    }
    if (queues->work_queue_ == (CVmGramProdState *)0x0) break;
    process_work_queue_head(mem,tok,tok_cnt,queues,dict);
  }
  return;
}

Assistant:

void CVmObjGramProd::process_work_queue(VMG_ CVmGramProdMem *mem,
                                        const vmgramprod_tok *tok,
                                        size_t tok_cnt,
                                        CVmGramProdQueue *queues,
                                        CVmObjDict *dict)
{
    /* keep going until the work queue and badness queue are empty */
    for (;;)
    {
        /* 
         *   If the work queue is empty, fall back on the badness queue.
         *   Ignore the badness queue if we have any successful matches,
         *   since non-badness matches always take precedence over badness
         *   items. 
         */
        if (queues->work_queue_ == 0 && queues->success_list_ == 0)
        {
            int first;
            int min_badness;
            CVmGramProdState *cur;
            CVmGramProdState *prv;
            CVmGramProdState *nxt;
            
            /* find the lowest badness rating in the queue */
            for (first = TRUE, min_badness = 0, cur = queues->badness_queue_ ;
                 cur != 0 ; cur = cur->nxt_, first = FALSE)
            {
                /* 
                 *   if we're on the first item, note its badness as the
                 *   tentative minimum; otherwise, note the current item's
                 *   badness if it's lower than the lowest we've seen so
                 *   far 
                 */
                if (first || cur->altp_->badness < min_badness)
                    min_badness = cur->altp_->badness;
            }

            /* 
             *   move each of the items whose badness matches the minimum
             *   badness out of the badness queue and into the work queue 
             */
            for (cur = queues->badness_queue_, prv = 0 ; cur != 0 ;
                 cur = nxt)
            {
                /* remember the next item, in case we remove this one */
                nxt = cur->nxt_;
                
                /* if this item has minimum badness, move it */
                if (cur->altp_->badness == min_badness)
                {
                    /* unlink it from the badness queue */
                    if (prv == 0)
                        queues->badness_queue_ = cur->nxt_;
                    else
                        prv->nxt_ = cur->nxt_;

                    /* link it into the work queue */
                    cur->nxt_ = queues->work_queue_;
                    queues->work_queue_ = cur;
                }
                else
                {
                    /* 
                     *   this item is staying in the list - note it as the
                     *   item preceding the next item 
                     */
                    prv = cur;
                }
            }
        }

        /* if the work queue is still empty, we're out of work to do */
        if (queues->work_queue_ == 0)
            break;
        
        /* process the head of the work queue */
        process_work_queue_head(vmg_ mem, tok, tok_cnt, queues, dict);
    }
}